

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

PassToken __thiscall
spvtools::CreateReduceLoadSizePass(spvtools *this,double load_replacement_threshold)

{
  Pass *this_00;
  undefined8 *puVar1;
  
  this_00 = (Pass *)operator_new(0x78);
  opt::Pass::Pass(this_00);
  this_00->_vptr_Pass = (_func_int **)&PTR__ReduceLoadSize_00b15ff8;
  this_00[1]._vptr_Pass = (_func_int **)load_replacement_threshold;
  *(Pass **)&this_00[1].consumer_.super__Function_base._M_functor = this_00 + 2;
  *(undefined8 *)((long)&this_00[1].consumer_.super__Function_base._M_functor + 8) = 1;
  this_00[1].consumer_.super__Function_base._M_manager = (_Manager_type)0x0;
  this_00[1].consumer_._M_invoker = (_Invoker_type)0x0;
  *(undefined4 *)&this_00[1].context_ = 0x3f800000;
  *(undefined8 *)&this_00[1].already_run_ = 0;
  this_00[2]._vptr_Pass = (_func_int **)0x0;
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = this_00;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateReduceLoadSizePass(
    double load_replacement_threshold) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::ReduceLoadSize>(load_replacement_threshold));
}